

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_lib.c
# Opt level: O0

void libdef_endmodule(BuildCtx *ctx)

{
  int iVar1;
  int local_74;
  uint8_t *puStack_70;
  int n;
  uint8_t *p;
  char line [80];
  BuildCtx *ctx_local;
  
  if (modstate != 0) {
    if (modstate == 1) {
      fprintf((FILE *)ctx->fp,"  (lua_CFunction)0");
    }
    fprintf((FILE *)ctx->fp,"\n};\n");
    fprintf((FILE *)ctx->fp,"static const uint8_t %s%s[] = {\n","lj_lib_init_",modname);
    p._0_1_ = 0;
    local_74 = 0;
    for (puStack_70 = obuf; puStack_70 < optr; puStack_70 = puStack_70 + 1) {
      iVar1 = sprintf(line + (long)local_74 + -8,"%d,",(ulong)*puStack_70);
      local_74 = iVar1 + local_74;
      if (0x4a < local_74) {
        fprintf((FILE *)ctx->fp,"%s\n",&p);
        local_74 = 0;
        p._0_1_ = 0;
      }
    }
    fprintf((FILE *)ctx->fp,"%s%d\n};\n#endif\n\n",&p,0xff);
  }
  return;
}

Assistant:

static void libdef_endmodule(BuildCtx *ctx)
{
  if (modstate != 0) {
    char line[80];
    const uint8_t *p;
    int n;
    if (modstate == 1)
      fprintf(ctx->fp, "  (lua_CFunction)0");
    fprintf(ctx->fp, "\n};\n");
    fprintf(ctx->fp, "static const uint8_t %s%s[] = {\n",
	    LABEL_PREFIX_LIBINIT, modname);
    line[0] = '\0';
    for (n = 0, p = obuf; p < optr; p++) {
      n += sprintf(line+n, "%d,", *p);
      if (n >= 75) {
	fprintf(ctx->fp, "%s\n", line);
	n = 0;
	line[0] = '\0';
      }
    }
    fprintf(ctx->fp, "%s%d\n};\n#endif\n\n", line, LIBINIT_END);
  }
}